

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

bool __thiscall VkSpecParser::parse(VkSpecParser *this)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  char16_t *pcVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView local_98;
  undefined1 local_88 [24];
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QFile::setFileName((QString *)this);
  cVar1 = QFile::open(this,0x11);
  if (cVar1 == '\0') {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_40 = "default";
    QFile::fileName();
    QString::toLocal8Bit((QByteArray *)&local_70,(QString *)local_88);
    pcVar4 = local_70.ptr;
    if (local_70.ptr == (char16_t *)0x0) {
      pcVar4 = (char16_t *)&QByteArray::_empty;
    }
    QMessageLogger::warning((char *)&local_58,"Failed to open %s",pcVar4);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
  }
  else {
    QXmlStreamReader::setDevice((QIODevice *)&this->m_reader);
    QList<VkSpecParser::Command>::clear(&this->m_commands);
    QMap<QString,_QList<QString>_>::clear(&this->m_versionCommandMapping);
    while( true ) {
      cVar2 = QXmlStreamReader::atEnd();
      if (cVar2 != '\0') break;
      QXmlStreamReader::readNext();
      bVar3 = QXmlStreamReader::isStartElement(&this->m_reader);
      if (bVar3) {
        QVar5 = (QStringView)QXmlStreamReader::name();
        local_58.d._0_4_ = 0;
        local_58.d._4_4_ = 0;
        local_70.d = (Data *)0x0;
        local_70.ptr = (char16_t *)0x0;
        local_70.size = 0;
        local_58.ptr._0_4_ = 0x10a0c6;
        local_58.ptr._4_4_ = 0;
        local_58.size._0_4_ = 8;
        local_58.size._4_4_ = 0;
        local_98.m_size = 8;
        local_98.m_data = L"commands";
        local_88._0_16_ = (undefined1  [16])QVar5;
        bVar3 = comparesEqual((QStringView *)local_88,&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
        if (bVar3) {
          parseCommands(this);
        }
        else {
          QVar5 = (QStringView)QXmlStreamReader::name();
          local_58.d._0_4_ = 0;
          local_58.d._4_4_ = 0;
          local_70.d = (Data *)0x0;
          local_70.ptr = (char16_t *)0x0;
          local_70.size = 0;
          local_58.ptr._0_4_ = 0x10a0d8;
          local_58.ptr._4_4_ = 0;
          local_58.size._0_4_ = 7;
          local_58.size._4_4_ = 0;
          local_98.m_size = 7;
          local_98.m_data = L"feature";
          local_88._0_16_ = (undefined1  [16])QVar5;
          bVar3 = comparesEqual((QStringView *)local_88,&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
          if (bVar3) {
            parseFeature(this);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool VkSpecParser::parse()
{
    m_file.setFileName(m_fn);
    if (!m_file.open(QIODevice::ReadOnly | QIODevice::Text)) {
        qWarning("Failed to open %s", qPrintable(m_file.fileName()));
        return false;
    }
    m_reader.setDevice(&m_file);

    m_commands.clear();
    m_versionCommandMapping.clear();

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isStartElement()) {
            if (m_reader.name() == QStringLiteral("commands"))
                parseCommands();
            else if (m_reader.name() == QStringLiteral("feature"))
                parseFeature();
        }
    }

    return true;
}